

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void write_vector_int<QPDF::HPageOffsetEntry,int>
               (BitWriter *w,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,int bits
               ,offset_in_HPageOffsetEntry_to_int field)

{
  int iVar1;
  pointer pHVar2;
  ulong uVar3;
  type ii_1;
  type ii;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar4) break;
    pHVar2 = (vec->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(vec->
                   super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
    iVar1 = *(int *)((long)&pHVar2->delta_nobjects + field);
    if (iVar1 < 0) {
      QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar1);
    }
    iVar1 = *(int *)((long)&pHVar2->delta_nobjects + field);
    if (bits < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(bits);
    }
    BitWriter::writeBits(w,(long)iVar1,(long)bits);
    uVar4 = uVar4 + 1;
    field = field + 0x58;
  }
  BitWriter::flush(w);
  return;
}

Assistant:

static void
write_vector_int(BitWriter& w, int nitems, std::vector<T>& vec, int bits, int_type T::* field)
{
    // nitems times, write bits bits from the given field of the ith vector to the given bit writer.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        w.writeBits(QIntC::to_ulonglong(vec.at(i).*field), QIntC::to_size(bits));
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    w.flush();
}